

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

void google::protobuf::internal::arena_destruct_object<google::protobuf::RepeatedField<bool>>
               (void *object)

{
  long *plVar1;
  
  plVar1 = *(long **)((long)object + 8);
  if ((plVar1 != (long *)0x0) && (*plVar1 == 0)) {
    operator_delete(plVar1,(long)*(int *)((long)object + 4) + 8);
    return;
  }
  return;
}

Assistant:

void arena_delete_object(void* object) {
  delete reinterpret_cast<T*>(object);
}